

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O1

bool sptk::ComputeSecondOrderRegressionCoefficients
               (int n,vector<double,_std::allocator<double>_> *coefficients)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  long lVar14;
  
  if (coefficients != (vector<double,_std::allocator<double>_> *)0x0 && 0 < n) {
    uVar10 = n * 2 + 1;
    if ((long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (ulong)uVar10) {
      std::vector<double,_std::allocator<double>_>::resize(coefficients,(ulong)uVar10);
    }
    auVar2 = _DAT_00117a90;
    uVar5 = (n + 1) * n * uVar10;
    uVar4 = uVar5 / 3;
    uVar5 = uVar5 / 3;
    dVar11 = 0.5 / (double)(int)(((((n * 3 + 3) * n + -1) * uVar4) / 5) * uVar10 - uVar4 * uVar5);
    pdVar1 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = n * 2;
    auVar12._4_4_ = 0;
    auVar12._0_4_ = uVar4;
    auVar12._8_4_ = uVar4;
    auVar12._12_4_ = 0;
    iVar3 = -(n * uVar10);
    iVar7 = n * 4 + 2;
    iVar6 = -n;
    iVar8 = (1 - n) * uVar10;
    lVar9 = 0;
    auVar12 = auVar12 ^ _DAT_00117a90;
    auVar13 = _DAT_00117a80;
    do {
      auVar15 = auVar13 ^ auVar2;
      if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                  auVar12._4_4_ < auVar15._4_4_) & 1)) {
        *(double *)((long)pdVar1 + lVar9) = (double)(int)(iVar3 * iVar6 - uVar5) * dVar11;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        *(double *)((long)pdVar1 + lVar9 + 8) = (double)(int)((iVar6 + 1) * iVar8 - uVar5) * dVar11;
      }
      lVar14 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar14 + 2;
      lVar9 = lVar9 + 0x10;
      iVar3 = iVar3 + iVar7;
      iVar6 = iVar6 + 2;
      iVar8 = iVar8 + iVar7;
    } while ((ulong)uVar4 * 8 + 0x10 != lVar9);
  }
  return coefficients != (vector<double,_std::allocator<double>_> *)0x0 && 0 < n;
}

Assistant:

bool ComputeSecondOrderRegressionCoefficients(
    int n, std::vector<double>* coefficients) {
  if (n <= 0 || NULL == coefficients) {
    return false;
  }

  const int a0(2 * n + 1);
  if (coefficients->size() != static_cast<std::size_t>(a0)) {
    coefficients->resize(a0);
  }
  const int a1(a0 * n * (n + 1) / 3);
  const int a2(a1 * (3 * n * n + 3 * n - 1) / 5);
  const double norm(0.5 / (a2 * a0 - a1 * a1));
  for (int j(-n), i(0); j <= n; ++j, ++i) {
    (*coefficients)[i] = (a0 * j * j - a1) * norm;
  }
  return true;
}